

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.h
# Opt level: O0

Connection
QObject::
connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(QModelIndex_const&,int,int,QModelIndex_const&,int)>>
          (Object *sender,offset_in_QAbstractItemModel_to_subr signal,ContextType *context,
          _Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int)>
          *slot,ConnectionType type)

{
  long lVar1;
  void *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000008;
  QSlotObjectBase *in_stack_00000020;
  void **in_stack_00000028;
  QObject *in_stack_00000030;
  void **in_stack_00000038;
  QObject *in_stack_00000040;
  void **pSlot;
  int *types;
  int SlotArgumentCount;
  int FunctorArgumentCount;
  ConnectionType in_stack_000000f0;
  int *in_stack_000000f8;
  QMetaObject *in_stack_00000100;
  _Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int)>
  *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_stack_00000008 == 2) || (in_stack_00000008 == 3)) {
    QtPrivate::
    ConnectionTypes<QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int,_QAbstractItemModel::QPrivateSignal>,_false>
    ::types();
  }
  QtPrivate::
  makeCallableObject<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(QModelIndex_const&,int,int,QModelIndex_const&,int)>>
            (in_stack_ffffffffffffff70);
  connectImpl(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
              in_stack_00000020,in_stack_000000f0,in_stack_000000f8,in_stack_00000100);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Connection)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QMetaObject::Connection
        connect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                const typename QtPrivate::ContextTypeForFunctor<Func2>::ContextType *context, Func2 &&slot,
                Qt::ConnectionType type = Qt::AutoConnection)
    {
        typedef QtPrivate::FunctionPointer<Func1> SignalType;
        typedef QtPrivate::FunctionPointer<std::decay_t<Func2>> SlotType;

        if constexpr (SlotType::ArgumentCount != -1) {
            static_assert((QtPrivate::AreArgumentsCompatible<typename SlotType::ReturnType, typename SignalType::ReturnType>::value),
                            "Return type of the slot is not compatible with the return type of the signal.");
        } else {
            constexpr int FunctorArgumentCount = QtPrivate::ComputeFunctorArgumentCount<std::decay_t<Func2>, typename SignalType::Arguments>::Value;
            [[maybe_unused]]
            constexpr int SlotArgumentCount = (FunctorArgumentCount >= 0) ? FunctorArgumentCount : 0;
            typedef typename QtPrivate::FunctorReturnType<std::decay_t<Func2>, typename QtPrivate::List_Left<typename SignalType::Arguments, SlotArgumentCount>::Value>::type SlotReturnType;

            static_assert((QtPrivate::AreArgumentsCompatible<SlotReturnType, typename SignalType::ReturnType>::value),
                            "Return type of the slot is not compatible with the return type of the signal.");
        }

        static_assert(QtPrivate::HasQ_OBJECT_Macro<typename SignalType::Object>::Value,
                          "No Q_OBJECT in the class with the signal");

        //compilation error if the arguments does not match.
        static_assert(int(SignalType::ArgumentCount) >= int(SlotType::ArgumentCount),
                          "The slot requires more arguments than the signal provides.");

        const int *types = nullptr;
        if (type == Qt::QueuedConnection || type == Qt::BlockingQueuedConnection)
            types = QtPrivate::ConnectionTypes<typename SignalType::Arguments>::types();

        void **pSlot = nullptr;
        if constexpr (std::is_member_function_pointer_v<std::decay_t<Func2>>) {
            pSlot = const_cast<void **>(reinterpret_cast<void *const *>(&slot));
        } else {
            Q_ASSERT_X((type & Qt::UniqueConnection) == 0, "",
                       "QObject::connect: Unique connection requires the slot to be a pointer to "
                       "a member function of a QObject subclass.");
        }

        return connectImpl(sender, reinterpret_cast<void **>(&signal), context, pSlot,
                           QtPrivate::makeCallableObject<Func1>(std::forward<Func2>(slot)),
                           type, types, &SignalType::Object::staticMetaObject);
    }